

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<VariableTypeRemap,_8UL>::push_back
          (SmallVector<VariableTypeRemap,_8UL> *this,VariableTypeRemap *t)

{
  size_t *psVar1;
  
  reserve(this,(this->super_VectorView<VariableTypeRemap>).buffer_size + 1);
  VariableTypeRemap::VariableTypeRemap
            ((this->super_VectorView<VariableTypeRemap>).ptr +
             (this->super_VectorView<VariableTypeRemap>).buffer_size,t);
  psVar1 = &(this->super_VectorView<VariableTypeRemap>).buffer_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}